

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

bool __thiscall just::test::test_manager::run(test_manager *this,ostream *report_)

{
  pointer ptVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  pointer this_00;
  
  ptVar1 = (this->_cases).
           super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>._M_impl
           .super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (this_00 = (this->_cases).
                 super__Vector_base<just::test::test_case,_std::allocator<just::test::test_case>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != ptVar1; this_00 = this_00 + 1)
  {
    bVar2 = test_case::run(this_00,report_);
    iVar4 = iVar4 + (uint)!bVar2;
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)report_);
  poVar3 = std::operator<<(poVar3," test cases finished.");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (iVar4 == 0) {
    pcVar5 = "  All succeeded.";
  }
  else {
    poVar3 = std::operator<<(report_,"  ");
    report_ = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
    pcVar5 = " failed.";
  }
  poVar3 = std::operator<<(report_,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return iVar4 == 0;
}

Assistant:

bool run(std::ostream& report_) const
      {
        int failures = 0;
        for (
          std::vector<test_case>::const_iterator
            i = _cases.begin(),
            e = _cases.end();
          i != e;
          ++i
        )
        {
          if (!i->run(report_))
          {
            ++failures;
          }
        }
        report_ << _cases.size() << " test cases finished." << std::endl;
        if (failures > 0)
        {
          report_ << "  " << failures << " failed." << std::endl;
        }
        else
        {
          report_ << "  All succeeded." << std::endl;
        }
        return failures == 0;
      }